

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2.cpp
# Opt level: O0

bool __thiscall QGles2TextureRenderTarget::create(QGles2TextureRenderTarget *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QRhiImplementation *this_00;
  Data *pDVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  Format FVar8;
  GLenum GVar9;
  qsizetype qVar10;
  QRhiRenderBuffer *pQVar11;
  QRhiTexture *pQVar12;
  ulong uVar13;
  QRhiColorAttachment *pQVar14;
  QRhiTexture *pQVar15;
  char *pcVar16;
  long *in_RDI;
  long in_FS_OFFSET;
  bool bVar17;
  GLenum status;
  QGles2Texture *depthResolveTexD_1;
  QGles2Texture *depthResolveTexD;
  QGles2Texture *depthTexD;
  QGles2RenderBuffer *depthRbD;
  GLenum faceTargetBase_2;
  QGles2Texture *resolveTexD_2;
  QGles2RenderBuffer *rbD;
  GLenum faceTargetBase_1;
  GLenum faceTargetBase;
  QGles2Texture *resolveTexD_1;
  QGles2Texture *resolveTexD;
  QGles2Texture *texD;
  QRhiRenderBuffer *renderBuffer;
  QRhiTexture *texture;
  QRhiColorAttachment *colorAtt;
  QRhiColorAttachment *itEnd;
  QRhiColorAttachment *it;
  int multiViewCount;
  int attIndex;
  int count;
  bool hasDepthStencil;
  bool hasColorAttachments;
  QRhiGles2 *rhiD;
  GLuint in_stack_fffffffffffffcf8;
  Flag in_stack_fffffffffffffcfc;
  GLuint in_stack_fffffffffffffd00;
  GLuint in_stack_fffffffffffffd04;
  GLenum in_stack_fffffffffffffd08;
  GLenum in_stack_fffffffffffffd0c;
  QRhiGles2 *in_stack_fffffffffffffd10;
  undefined1 ownsNativeResources;
  QRhiImplementation *in_stack_fffffffffffffd18;
  GLsizei in_stack_fffffffffffffd20;
  ResIdList *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd5c;
  int local_23c;
  int local_1f4;
  bool local_192;
  QRhiColorAttachment *local_108;
  GLuint local_100;
  int local_fc;
  bool local_d9;
  char local_d8 [32];
  QSize local_b8;
  QSize local_b0;
  QSize local_a8;
  char local_a0 [32];
  QSize local_80;
  QSize local_78;
  QFlagsStorageHelper<QRhiTexture::Flag,_4> local_70;
  QSize local_6c;
  QSize local_64;
  QFlagsStorageHelper<QRhiTexture::Flag,_4> local_5c;
  QFlagsStorageHelper<QRhiTexture::Flag,_4> local_58;
  QFlagsStorageHelper<QRhiTexture::Flag,_4> local_54;
  QFlagsStorageHelper<QRhiTexture::Flag,_4> local_50;
  QFlagsStorageHelper<QRhiTexture::Flag,_4> local_4c;
  char local_48 [32];
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QRhiImplementation *)in_RDI[1];
  if ((int)in_RDI[0x6a] != 0) {
    (**(code **)(*in_RDI + 0x18))();
  }
  qVar10 = QRhiTextureRenderTargetDescription::colorAttachmentCount
                     ((QRhiTextureRenderTargetDescription *)0x92f558);
  pQVar11 = QRhiTextureRenderTargetDescription::depthStencilBuffer
                      ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
  bVar17 = true;
  if (pQVar11 == (QRhiRenderBuffer *)0x0) {
    pQVar12 = QRhiTextureRenderTargetDescription::depthTexture
                        ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
    bVar17 = pQVar12 != (QRhiTexture *)0x0;
  }
  if ((0 < qVar10) &&
     (uVar13 = QRhiTextureRenderTargetDescription::colorAttachmentCount
                         ((QRhiTextureRenderTargetDescription *)0x92f5d5),
     *(int *)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x30) <
     (int)uVar13)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd10,
               (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
               in_stack_fffffffffffffd04,
               (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QMessageLogger::warning
              (local_28,"QGles2TextureRenderTarget: Too many color attachments (%d, max is %d)",
               uVar13 & 0xffffffff,
               (ulong)*(uint *)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array
                               + 0x30));
  }
  pQVar12 = QRhiTextureRenderTargetDescription::depthTexture
                      ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
  if ((pQVar12 != (QRhiTexture *)0x0) &&
     ((*(uint *)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x5c) >> 0xc
      & 1) == 0)) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffd10,
               (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
               in_stack_fffffffffffffd04,
               (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    QMessageLogger::warning
              (local_48,
               "QGles2TextureRenderTarget: Depth texture is not supported and will be ignored");
  }
  bVar5 = QRhiGles2::ensureContext
                    (in_stack_fffffffffffffd10,
                     (QSurface *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  if (bVar5) {
    QOpenGLFunctions::glGenFramebuffers
              ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcfc,(GLuint *)0x92f6dc);
    QOpenGLFunctions::glBindFramebuffer
              ((QOpenGLFunctions *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
               in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
    *(undefined4 *)(in_RDI + 0x42) = 0;
    local_fc = 0;
    local_100 = 0;
    local_108 = QRhiTextureRenderTargetDescription::cbeginColorAttachments
                          ((QRhiTextureRenderTargetDescription *)0x92f734);
    pQVar14 = QRhiTextureRenderTargetDescription::cendColorAttachments
                        ((QRhiTextureRenderTargetDescription *)0x92f74d);
    for (; local_108 != pQVar14; local_108 = local_108 + 1) {
      *(int *)(in_RDI + 0x42) = (int)in_RDI[0x42] + 1;
      pQVar12 = QRhiColorAttachment::texture(local_108);
      pQVar11 = QRhiColorAttachment::renderBuffer(local_108);
      if (pQVar12 == (QRhiTexture *)0x0) {
        if (pQVar11 != (QRhiRenderBuffer *)0x0) {
          iVar7 = QRhiRenderBuffer::sampleCount(pQVar11);
          if (((iVar7 < 2) ||
              ((*(ushort *)
                 (this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x60) >> 8 &
               1) == 0)) ||
             (pQVar12 = QRhiColorAttachment::resolveTexture(local_108),
             pQVar12 == (QRhiTexture *)0x0)) {
            QOpenGLFunctions::glFramebufferRenderbuffer
                      ((QOpenGLFunctions *)
                       CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,0,0x93006c);
          }
          else {
            pQVar12 = QRhiColorAttachment::resolveTexture(local_108);
            local_70.super_QFlagsStorage<QRhiTexture::Flag>.i =
                 (QFlagsStorage<QRhiTexture::Flag>)
                 QRhiTexture::flags((QRhiTexture *)
                                    CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
            bVar5 = QFlags<QRhiTexture::Flag>::testFlag
                              ((QFlags<QRhiTexture::Flag> *)
                               CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                               in_stack_fffffffffffffcfc);
            if (bVar5) {
              local_23c = 0x8515;
            }
            else {
              local_23c = *(int *)((long)&pQVar12[1].super_QRhiResource._vptr_QRhiResource + 4);
            }
            pcVar4 = *(code **)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array
                               + 8);
            iVar7 = QRhiColorAttachment::resolveLayer(local_108);
            uVar1 = *(undefined4 *)&pQVar12->field_0x64;
            QRhiColorAttachment::level(local_108);
            QRhiRenderBuffer::sampleCount(pQVar11);
            (*pcVar4)(0x8d40,local_fc + 0x8ce0,local_23c + iVar7,uVar1);
          }
          if (local_fc == 0) {
            local_78 = QRhiRenderBuffer::pixelSize
                                 ((QRhiRenderBuffer *)
                                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
            *(QSize *)(in_RDI + 0x40) = local_78;
            *(undefined4 *)((long)in_RDI + 0x20c) =
                 *(undefined4 *)&pQVar11[1].super_QRhiResource.m_rhi;
          }
        }
      }
      else {
        local_4c.super_QFlagsStorage<QRhiTexture::Flag>.i =
             (QFlagsStorage<QRhiTexture::Flag>)
             QRhiTexture::flags((QRhiTexture *)
                                CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
        bVar5 = QFlags<QRhiTexture::Flag>::testFlag
                          ((QFlags<QRhiTexture::Flag> *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           in_stack_fffffffffffffcfc);
        local_192 = true;
        if (!bVar5) {
          local_50.super_QFlagsStorage<QRhiTexture::Flag>.i =
               (QFlagsStorage<QRhiTexture::Flag>)
               QRhiTexture::flags((QRhiTexture *)
                                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          local_192 = QFlags<QRhiTexture::Flag>::testFlag
                                ((QFlags<QRhiTexture::Flag> *)
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                 in_stack_fffffffffffffcfc);
        }
        if (local_192 == false) {
          local_54.super_QFlagsStorage<QRhiTexture::Flag>.i =
               (QFlagsStorage<QRhiTexture::Flag>)
               QRhiTexture::flags((QRhiTexture *)
                                  CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          bVar5 = QFlags<QRhiTexture::Flag>::testFlag
                            ((QFlags<QRhiTexture::Flag> *)
                             CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                             in_stack_fffffffffffffcfc);
          if (bVar5) {
            pDVar3 = this_00[1].pendingDeleteResources.q_hash.d;
            iVar7 = *(int *)((long)&pQVar12[1].super_QRhiResource._vptr_QRhiResource + 4);
            iVar6 = QRhiColorAttachment::layer(local_108);
            uVar1 = *(undefined4 *)&pQVar12->field_0x64;
            QRhiColorAttachment::level(local_108);
            (*(code *)pDVar3)(0x8d40,local_fc + 0x8ce0,iVar7 + iVar6,uVar1);
          }
          else {
            iVar7 = QRhiTexture::sampleCount(pQVar12);
            if (((iVar7 < 2) ||
                ((*(ushort *)
                   (this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x60) >> 8
                 & 1) == 0)) ||
               (pQVar15 = QRhiColorAttachment::resolveTexture(local_108),
               pQVar15 == (QRhiTexture *)0x0)) {
              local_5c.super_QFlagsStorage<QRhiTexture::Flag>.i =
                   (QFlagsStorage<QRhiTexture::Flag>)
                   QRhiTexture::flags((QRhiTexture *)
                                      CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
              ;
              QFlags<QRhiTexture::Flag>::testFlag
                        ((QFlags<QRhiTexture::Flag> *)
                         CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                         in_stack_fffffffffffffcfc);
              QRhiColorAttachment::layer(local_108);
              QRhiColorAttachment::level(local_108);
              QOpenGLFunctions::glFramebufferTexture2D
                        ((QOpenGLFunctions *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
                         in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                         in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
            }
            else {
              pQVar15 = QRhiColorAttachment::resolveTexture(local_108);
              local_58.super_QFlagsStorage<QRhiTexture::Flag>.i =
                   (QFlagsStorage<QRhiTexture::Flag>)
                   QRhiTexture::flags((QRhiTexture *)
                                      CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
              ;
              bVar5 = QFlags<QRhiTexture::Flag>::testFlag
                                ((QFlags<QRhiTexture::Flag> *)
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                 in_stack_fffffffffffffcfc);
              if (bVar5) {
                local_1f4 = 0x8515;
              }
              else {
                local_1f4 = *(int *)((long)&pQVar15[1].super_QRhiResource._vptr_QRhiResource + 4);
              }
              pcVar4 = *(code **)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.
                                  array + 8);
              iVar7 = QRhiColorAttachment::resolveLayer(local_108);
              uVar1 = *(undefined4 *)&pQVar15->field_0x64;
              QRhiColorAttachment::level(local_108);
              QRhiTexture::sampleCount(pQVar12);
              (*pcVar4)(0x8d40,local_fc + 0x8ce0,local_1f4 + iVar7,uVar1);
            }
          }
        }
        else {
          iVar7 = QRhiColorAttachment::multiViewCount(local_108);
          if (iVar7 < 2) {
            QRhiColorAttachment::level(local_108);
            QRhiColorAttachment::layer(local_108);
            QOpenGLExtraFunctions::glFramebufferTextureLayer
                      ((QOpenGLExtraFunctions *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
                       in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffd00
                       ,in_stack_fffffffffffffcfc);
          }
          else {
            local_100 = QRhiColorAttachment::multiViewCount(local_108);
            iVar7 = QRhiTexture::sampleCount(pQVar12);
            if (((iVar7 < 2) ||
                ((*(ushort *)
                   (this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x60) >> 9
                 & 1) == 0)) ||
               (pQVar15 = QRhiColorAttachment::resolveTexture(local_108),
               pQVar15 == (QRhiTexture *)0x0)) {
              pcVar4 = (code *)this_00[1].cleanupCallbacks.
                               super_QVLABase<std::function<void_(QRhi_*)>_>.super_QVLABaseBase.a;
              uVar1 = *(undefined4 *)&pQVar12->field_0x64;
              iVar7 = QRhiColorAttachment::level(local_108);
              QRhiColorAttachment::layer(local_108);
              (*pcVar4)(0x8d40,local_fc + 0x8ce0,uVar1,iVar7);
            }
            else {
              pQVar15 = QRhiColorAttachment::resolveTexture(local_108);
              pcVar4 = *(code **)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.
                                  array + 0x10);
              uVar1 = *(undefined4 *)&pQVar15->field_0x64;
              iVar7 = QRhiColorAttachment::resolveLevel(local_108);
              QRhiTexture::sampleCount(pQVar12);
              QRhiColorAttachment::resolveLayer(local_108);
              in_stack_fffffffffffffcf8 = local_100;
              (*pcVar4)(0x8d40,local_fc + 0x8ce0,uVar1,iVar7);
            }
          }
        }
        if (local_fc == 0) {
          QRhiColorAttachment::level(local_108);
          local_6c = QRhiTexture::pixelSize
                               ((QRhiTexture *)
                                CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          local_64 = QRhi::sizeForMipLevel
                               ((int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                                (QSize *)CONCAT44(in_stack_fffffffffffffd0c,
                                                  in_stack_fffffffffffffd08));
          *(QSize *)(in_RDI + 0x40) = local_64;
          iVar7 = QRhiTexture::sampleCount(pQVar12);
          *(int *)((long)in_RDI + 0x20c) = iVar7;
        }
      }
      local_fc = local_fc + 1;
    }
    if (bVar17) {
      pQVar11 = QRhiTextureRenderTargetDescription::depthStencilBuffer
                          ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
      if (pQVar11 == (QRhiRenderBuffer *)0x0) {
        pQVar12 = QRhiTextureRenderTargetDescription::depthTexture
                            ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
        if ((int)local_100 < 2) {
          iVar7 = QRhiTexture::sampleCount(pQVar12);
          if (((iVar7 < 2) ||
              ((*(ushort *)
                 (this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x60) >> 8 &
               1) == 0)) ||
             (pQVar15 = QRhiTextureRenderTargetDescription::depthResolveTexture
                                  ((QRhiTextureRenderTargetDescription *)(in_RDI + 7)),
             pQVar15 == (QRhiTexture *)0x0)) {
            QOpenGLFunctions::glFramebufferTexture2D
                      ((QOpenGLFunctions *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
                       in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,in_stack_fffffffffffffd00
                       ,in_stack_fffffffffffffcfc);
            FVar8 = QRhiTexture::format(pQVar12);
            bVar17 = QRhiImplementation::isStencilSupportingFormat(this_00,FVar8);
            if (bVar17) {
              QOpenGLFunctions::glFramebufferTexture2D
                        ((QOpenGLFunctions *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c,
                         in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                         in_stack_fffffffffffffd00,in_stack_fffffffffffffcfc);
            }
          }
          else {
            pQVar15 = QRhiTextureRenderTargetDescription::depthResolveTexture
                                ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
            pcVar4 = *(code **)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array
                               + 8);
            uVar1 = *(undefined4 *)((long)&pQVar15[1].super_QRhiResource._vptr_QRhiResource + 4);
            uVar2 = *(undefined4 *)&pQVar15->field_0x64;
            iVar7 = QRhiTexture::sampleCount(pQVar12);
            (*pcVar4)(0x8d40,0x8d00,uVar1,uVar2,0,iVar7);
            FVar8 = QRhiTexture::format(pQVar15);
            bVar17 = QRhiImplementation::isStencilSupportingFormat(this_00,FVar8);
            if (bVar17) {
              pcVar4 = *(code **)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.
                                  array + 8);
              uVar1 = *(undefined4 *)((long)&pQVar15[1].super_QRhiResource._vptr_QRhiResource + 4);
              uVar2 = *(undefined4 *)&pQVar15->field_0x64;
              iVar7 = QRhiTexture::sampleCount(pQVar12);
              (*pcVar4)(0x8d40,0x8d20,uVar1,uVar2,0,iVar7);
            }
          }
        }
        else {
          iVar7 = QRhiTexture::sampleCount(pQVar12);
          if ((iVar7 < 2) ||
             ((*(ushort *)
                (this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x60) >> 9 &
              1) == 0)) {
            (*(code *)this_00[1].cleanupCallbacks.super_QVLABase<std::function<void_(QRhi_*)>_>.
                      super_QVLABaseBase.a)
                      (0x8d40,0x8d00,*(undefined4 *)&pQVar12->field_0x64,0,0,local_100);
            in_stack_fffffffffffffd18 = this_00;
            FVar8 = QRhiTexture::format(pQVar12);
            bVar17 = QRhiImplementation::isStencilSupportingFormat(in_stack_fffffffffffffd18,FVar8);
            if (bVar17) {
              (*(code *)this_00[1].cleanupCallbacks.super_QVLABase<std::function<void_(QRhi_*)>_>.
                        super_QVLABaseBase.a)
                        (0x8d40,0x8d20,*(undefined4 *)&pQVar12->field_0x64,0,0,local_100);
            }
          }
          else {
            bVar17 = QFlags<QRhiTextureRenderTarget::Flag>::testFlag
                               ((QFlags<QRhiTextureRenderTarget::Flag> *)
                                CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                in_stack_fffffffffffffcfc);
            if ((!bVar17) &&
               (pQVar15 = QRhiTextureRenderTargetDescription::depthResolveTexture
                                    ((QRhiTextureRenderTargetDescription *)(in_RDI + 7)),
               pQVar15 == (QRhiTexture *)0x0)) {
              QMessageLogger::QMessageLogger
                        ((QMessageLogger *)in_stack_fffffffffffffd10,
                         (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                         in_stack_fffffffffffffd04,
                         (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
              QMessageLogger::warning
                        (local_a0,
                         "Attempted to create a multiview+multisample QRhiTextureRenderTarget, but DoNotStoreDepthStencilContents was not set. This path has no choice but to behave as if DoNotStoreDepthStencilContents was set, because QRhi is forced to create a throwaway non-multisample depth texture here. Set the flag to silence this warning, or set a depthResolveTexture."
                        );
            }
            pQVar15 = QRhiTextureRenderTargetDescription::depthResolveTexture
                                ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
            if (pQVar15 == (QRhiTexture *)0x0) {
              if (*(int *)((long)in_RDI + 0x354) == 0) {
                QOpenGLFunctions::glGenTextures
                          ((QOpenGLFunctions *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           in_stack_fffffffffffffcfc,(GLuint *)0x9306a7);
                QOpenGLFunctions::glBindTexture
                          ((QOpenGLFunctions *)
                           CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                           in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8);
                local_a8 = QRhiTexture::pixelSize
                                     ((QRhiTexture *)
                                      CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
                ;
                QSize::width((QSize *)0x930704);
                local_b0 = QRhiTexture::pixelSize
                                     ((QRhiTexture *)
                                      CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00))
                ;
                QSize::height((QSize *)0x93072a);
                QOpenGLExtraFunctions::glTexStorage3D
                          ((QOpenGLExtraFunctions *)in_stack_fffffffffffffd10,
                           in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08,
                           in_stack_fffffffffffffd04,in_stack_fffffffffffffd00,
                           in_stack_fffffffffffffcfc,in_stack_fffffffffffffd20);
              }
              pcVar4 = *(code **)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.
                                  array + 0x10);
              uVar1 = *(undefined4 *)((long)in_RDI + 0x354);
              iVar7 = QRhiTexture::sampleCount(pQVar12);
              (*pcVar4)(0x8d40,0x8d00,uVar1,0,iVar7,0,local_100);
              pcVar4 = *(code **)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.
                                  array + 0x10);
              uVar1 = *(undefined4 *)((long)in_RDI + 0x354);
              iVar7 = QRhiTexture::sampleCount(pQVar12);
              (*pcVar4)(0x8d40,0x8d20,uVar1,0,iVar7);
              in_stack_fffffffffffffcf8 = local_100;
            }
            else {
              pQVar15 = QRhiTextureRenderTargetDescription::depthResolveTexture
                                  ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
              pcVar4 = *(code **)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.
                                  array + 0x10);
              in_stack_fffffffffffffd5c = *(undefined4 *)&pQVar15->field_0x64;
              iVar7 = QRhiTexture::sampleCount(pQVar12);
              in_stack_fffffffffffffcf8 = local_100;
              (*pcVar4)(0x8d40,0x8d00,in_stack_fffffffffffffd5c,0,iVar7);
              FVar8 = QRhiTexture::format(pQVar15);
              bVar17 = QRhiImplementation::isStencilSupportingFormat(this_00,FVar8);
              if (bVar17) {
                in_stack_fffffffffffffd50 =
                     *(ResIdList **)
                      (this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x10);
                uVar1 = *(undefined4 *)&pQVar15->field_0x64;
                iVar7 = QRhiTexture::sampleCount(pQVar12);
                (*(code *)in_stack_fffffffffffffd50)(0x8d40,0x8d20,uVar1,0,iVar7);
                in_stack_fffffffffffffcf8 = local_100;
              }
            }
          }
        }
        if ((int)in_RDI[0x42] == 0) {
          local_b8 = QRhiTexture::pixelSize
                               ((QRhiTexture *)
                                CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          *(QSize *)(in_RDI + 0x40) = local_b8;
          iVar7 = QRhiTexture::sampleCount(pQVar12);
          *(int *)((long)in_RDI + 0x20c) = iVar7;
        }
      }
      else {
        pQVar11 = QRhiTextureRenderTargetDescription::depthStencilBuffer
                            ((QRhiTextureRenderTargetDescription *)(in_RDI + 7));
        if ((*(uint *)(this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array + 0x5c)
             >> 0xe & 1) == 0) {
          QOpenGLFunctions::glFramebufferRenderbuffer
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,0,0x9301a4);
          if (*(int *)((long)&pQVar11[1].super_QRhiResource._vptr_QRhiResource + 4) == 0) {
            QOpenGLFunctions::glFramebufferRenderbuffer
                      ((QOpenGLFunctions *)
                       CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,0,0x930212);
          }
          else {
            QOpenGLFunctions::glFramebufferRenderbuffer
                      ((QOpenGLFunctions *)
                       CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,0,0x9301e1);
          }
        }
        else {
          QOpenGLFunctions::glFramebufferRenderbuffer
                    ((QOpenGLFunctions *)
                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                     in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8,0,0x930170);
        }
        if ((int)in_RDI[0x42] == 0) {
          local_80 = QRhiRenderBuffer::pixelSize
                               ((QRhiRenderBuffer *)
                                CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
          *(QSize *)(in_RDI + 0x40) = local_80;
          *(undefined4 *)((long)in_RDI + 0x20c) =
               *(undefined4 *)&pQVar11[1].super_QRhiResource.m_rhi;
        }
      }
      *(undefined4 *)((long)in_RDI + 0x214) = 1;
    }
    else {
      *(undefined4 *)((long)in_RDI + 0x214) = 0;
    }
    *(undefined4 *)(in_RDI + 0x41) = 0x3f800000;
    in_RDI[0x3f] = in_RDI[6];
    GVar9 = QOpenGLFunctions::glCheckFramebufferStatus
                      ((QOpenGLFunctions *)
                       CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                       in_stack_fffffffffffffcfc);
    if ((GVar9 == 0) || (GVar9 == 0x8cd5)) {
      if (*(long *)this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array != 0) {
        in_stack_fffffffffffffd10 =
             *(QRhiGles2 **)this_00[1].cleanupCallbacks.super_QVLAStorage<32UL,_8UL,_4LL>.array;
        in_stack_fffffffffffffd0c = *(GLenum *)(in_RDI + 0x6a);
        pcVar16 = QByteArray::constData((QByteArray *)0x930a0c);
        (*(code *)in_stack_fffffffffffffd10)(0x8d40,in_stack_fffffffffffffd0c,0xffffffff,pcVar16);
      }
      ownsNativeResources = (undefined1)((ulong)in_stack_fffffffffffffd10 >> 0x38);
      QRhiRenderTargetAttachmentTracker::updateResIdList<QGles2Texture,QGles2RenderBuffer>
                ((QRhiTextureRenderTargetDescription *)
                 CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58),
                 in_stack_fffffffffffffd50);
      QRhiImplementation::registerResource
                ((QRhiImplementation *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08)
                 ,(QRhiResource *)in_stack_fffffffffffffd18,(bool)ownsNativeResources);
      local_d9 = true;
    }
    else {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffd10,
                 (char *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                 in_stack_fffffffffffffd04,
                 (char *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      QMessageLogger::warning(local_d8,"Framebuffer incomplete: 0x%x",(ulong)GVar9);
      local_d9 = false;
    }
  }
  else {
    local_d9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_d9;
  }
  __stack_chk_fail();
}

Assistant:

bool QGles2TextureRenderTarget::create()
{
    QRHI_RES_RHI(QRhiGles2);

    if (framebuffer)
        destroy();

    const bool hasColorAttachments = m_desc.colorAttachmentCount() > 0;
    Q_ASSERT(hasColorAttachments || m_desc.depthTexture());
    Q_ASSERT(!m_desc.depthStencilBuffer() || !m_desc.depthTexture());
    const bool hasDepthStencil = m_desc.depthStencilBuffer() || m_desc.depthTexture();

    if (hasColorAttachments) {
        const int count = int(m_desc.colorAttachmentCount());
        if (count > rhiD->caps.maxDrawBuffers) {
            qWarning("QGles2TextureRenderTarget: Too many color attachments (%d, max is %d)",
                     count, rhiD->caps.maxDrawBuffers);
        }
    }
    if (m_desc.depthTexture() && !rhiD->caps.depthTexture)
        qWarning("QGles2TextureRenderTarget: Depth texture is not supported and will be ignored");

    if (!rhiD->ensureContext())
        return false;

    rhiD->f->glGenFramebuffers(1, &framebuffer);
    rhiD->f->glBindFramebuffer(GL_FRAMEBUFFER, framebuffer);

    d.colorAttCount = 0;
    int attIndex = 0;
    int multiViewCount = 0;
    for (auto it = m_desc.cbeginColorAttachments(), itEnd = m_desc.cendColorAttachments(); it != itEnd; ++it, ++attIndex) {
        d.colorAttCount += 1;
        const QRhiColorAttachment &colorAtt(*it);
        QRhiTexture *texture = colorAtt.texture();
        QRhiRenderBuffer *renderBuffer = colorAtt.renderBuffer();
        Q_ASSERT(texture || renderBuffer);
        if (texture) {
            QGles2Texture *texD = QRHI_RES(QGles2Texture, texture);
            Q_ASSERT(texD->texture && texD->specified);
            if (texD->flags().testFlag(QRhiTexture::ThreeDimensional) || texD->flags().testFlag(QRhiTexture::TextureArray)) {
                if (colorAtt.multiViewCount() < 2) {
                    rhiD->f->glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), texD->texture,
                                                       colorAtt.level(), colorAtt.layer());
                } else {
                    multiViewCount = colorAtt.multiViewCount();
                    if (texD->sampleCount() > 1 && rhiD->caps.glesMultiviewMultisampleRenderToTexture && colorAtt.resolveTexture()) {
                        // Special path for GLES and GL_OVR_multiview_multisampled_render_to_texture:
                        // ignore the color attachment's (multisample) texture
                        // array and give the resolve texture array to GL. (no
                        // explicit resolving is needed by us later on)
                        QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
                        rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                          GL_COLOR_ATTACHMENT0 + uint(attIndex),
                                                                          resolveTexD->texture,
                                                                          colorAtt.resolveLevel(),
                                                                          texD->sampleCount(),
                                                                          colorAtt.resolveLayer(),
                                                                          multiViewCount);
                    } else {
                        rhiD->glFramebufferTextureMultiviewOVR(GL_FRAMEBUFFER,
                                                               GL_COLOR_ATTACHMENT0 + uint(attIndex),
                                                               texD->texture,
                                                               colorAtt.level(),
                                                               colorAtt.layer(),
                                                               multiViewCount);
                    }
                }
            } else if (texD->flags().testFlag(QRhiTexture::OneDimensional)) {
                rhiD->glFramebufferTexture1D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex),
                                             texD->target + uint(colorAtt.layer()), texD->texture,
                                             colorAtt.level());
            } else {
                if (texD->sampleCount() > 1 && rhiD->caps.glesMultisampleRenderToTexture && colorAtt.resolveTexture()) {
                    // Special path for GLES and GL_EXT_multisampled_render_to_texture:
                    // ignore the color attachment's (multisample) texture and
                    // give the resolve texture to GL. (no explicit resolving is
                    // needed by us later on)
                    QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
                    const GLenum faceTargetBase = resolveTexD->flags().testFlag(QRhiTexture::CubeMap) ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : resolveTexD->target;
                    rhiD->glFramebufferTexture2DMultisampleEXT(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), faceTargetBase + uint(colorAtt.resolveLayer()),
                                                               resolveTexD->texture, colorAtt.level(), texD->sampleCount());
                } else {
                    const GLenum faceTargetBase = texD->flags().testFlag(QRhiTexture::CubeMap) ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : texD->target;
                    rhiD->f->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), faceTargetBase + uint(colorAtt.layer()),
                                                    texD->texture, colorAtt.level());
                }
            }
            if (attIndex == 0) {
                d.pixelSize = rhiD->q->sizeForMipLevel(colorAtt.level(), texD->pixelSize());
                d.sampleCount = texD->sampleCount();
            }
        } else if (renderBuffer) {
            QGles2RenderBuffer *rbD = QRHI_RES(QGles2RenderBuffer, renderBuffer);
            if (rbD->sampleCount() > 1 && rhiD->caps.glesMultisampleRenderToTexture && colorAtt.resolveTexture()) {
                // Special path for GLES and GL_EXT_multisampled_render_to_texture: ignore
                // the (multisample) renderbuffer and give the resolve texture to GL. (so
                // no explicit resolve; depending on GL implementation internals, this may
                // play nicer with tiled architectures)
                QGles2Texture *resolveTexD = QRHI_RES(QGles2Texture, colorAtt.resolveTexture());
                const GLenum faceTargetBase = resolveTexD->flags().testFlag(QRhiTexture::CubeMap) ? GL_TEXTURE_CUBE_MAP_POSITIVE_X : resolveTexD->target;
                rhiD->glFramebufferTexture2DMultisampleEXT(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), faceTargetBase + uint(colorAtt.resolveLayer()),
                                                           resolveTexD->texture, colorAtt.level(), rbD->sampleCount());
            } else {
                rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + uint(attIndex), GL_RENDERBUFFER, rbD->renderbuffer);
            }
            if (attIndex == 0) {
                d.pixelSize = rbD->pixelSize();
                d.sampleCount = rbD->samples;
            }
        }
    }

    if (hasDepthStencil) {
        if (m_desc.depthStencilBuffer()) {
            QGles2RenderBuffer *depthRbD = QRHI_RES(QGles2RenderBuffer, m_desc.depthStencilBuffer());
            if (rhiD->caps.needsDepthStencilCombinedAttach) {
                rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER,
                                                   depthRbD->renderbuffer);
            } else {
                rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER,
                                                   depthRbD->renderbuffer);
                if (depthRbD->stencilRenderbuffer) {
                    rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER,
                                                       depthRbD->stencilRenderbuffer);
                } else {
                    // packed depth-stencil
                    rhiD->f->glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, GL_RENDERBUFFER,
                                                       depthRbD->renderbuffer);
                }
            }
            if (d.colorAttCount == 0) {
                d.pixelSize = depthRbD->pixelSize();
                d.sampleCount = depthRbD->samples;
            }
        } else {
            QGles2Texture *depthTexD = QRHI_RES(QGles2Texture, m_desc.depthTexture());
            if (multiViewCount < 2) {
                if (depthTexD->sampleCount() > 1 && rhiD->caps.glesMultisampleRenderToTexture && m_desc.depthResolveTexture()) {
                    // Special path for GLES and
                    // GL_EXT_multisampled_render_to_texture, for depth-stencil.
                    // Relevant only when depthResolveTexture is set.
                    QGles2Texture *depthResolveTexD = QRHI_RES(QGles2Texture, m_desc.depthResolveTexture());
                    rhiD->glFramebufferTexture2DMultisampleEXT(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depthResolveTexD->target,
                                                               depthResolveTexD->texture, 0, depthTexD->sampleCount());
                    if (rhiD->isStencilSupportingFormat(depthResolveTexD->format())) {
                        rhiD->glFramebufferTexture2DMultisampleEXT(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, depthResolveTexD->target,
                                                                   depthResolveTexD->texture, 0, depthTexD->sampleCount());
                    }
                } else {
                    rhiD->f->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depthTexD->target,
                                                    depthTexD->texture, 0);
                    if (rhiD->isStencilSupportingFormat(depthTexD->format())) {
                        rhiD->f->glFramebufferTexture2D(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, depthTexD->target,
                                                        depthTexD->texture, 0);
                    }
                }
            } else {
                if (depthTexD->sampleCount() > 1 && rhiD->caps.glesMultiviewMultisampleRenderToTexture) {
                    // And so it turns out
                    // https://registry.khronos.org/OpenGL/extensions/OVR/OVR_multiview.txt
                    // does not work with multisample 2D texture arrays. (at least
                    // that's what Issue 30 in the extension spec seems to imply)
                    //
                    // There is https://registry.khronos.org/OpenGL/extensions/EXT/EXT_multiview_texture_multisample.txt
                    // that seems to resolve that, but that does not seem to
                    // work (or not available) on GLES devices such as the Quest 3.
                    //
                    // So instead, on GLES we can use the
                    // multisample-multiview-auto-resolving version (which in
                    // turn is not supported on desktop GL e.g. by NVIDIA), too
                    // bad we have a multisample depth texture array here as
                    // every other API out there requires that. So, in absence
                    // of a depthResolveTexture, create a temporary one ignoring
                    // what the user has already created.
                    //
                    if (!m_flags.testFlag(DoNotStoreDepthStencilContents) && !m_desc.depthResolveTexture()) {
                        qWarning("Attempted to create a multiview+multisample QRhiTextureRenderTarget, but DoNotStoreDepthStencilContents was not set."
                                 " This path has no choice but to behave as if DoNotStoreDepthStencilContents was set, because QRhi is forced to create"
                                 " a throwaway non-multisample depth texture here. Set the flag to silence this warning, or set a depthResolveTexture.");
                    }
                    if (m_desc.depthResolveTexture()) {
                        QGles2Texture *depthResolveTexD = QRHI_RES(QGles2Texture, m_desc.depthResolveTexture());
                        rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                          GL_DEPTH_ATTACHMENT,
                                                                          depthResolveTexD->texture,
                                                                          0,
                                                                          depthTexD->sampleCount(),
                                                                          0,
                                                                          multiViewCount);
                        if (rhiD->isStencilSupportingFormat(depthResolveTexD->format())) {
                            rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                              GL_STENCIL_ATTACHMENT,
                                                                              depthResolveTexD->texture,
                                                                              0,
                                                                              depthTexD->sampleCount(),
                                                                              0,
                                                                              multiViewCount);
                        }
                    } else {
                        if (!nonMsaaThrowawayDepthTexture) {
                            rhiD->f->glGenTextures(1, &nonMsaaThrowawayDepthTexture);
                            rhiD->f->glBindTexture(GL_TEXTURE_2D_ARRAY, nonMsaaThrowawayDepthTexture);
                            rhiD->f->glTexStorage3D(GL_TEXTURE_2D_ARRAY, 1, GL_DEPTH24_STENCIL8,
                                                    depthTexD->pixelSize().width(), depthTexD->pixelSize().height(), multiViewCount);
                        }
                        rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                          GL_DEPTH_ATTACHMENT,
                                                                          nonMsaaThrowawayDepthTexture,
                                                                          0,
                                                                          depthTexD->sampleCount(),
                                                                          0,
                                                                          multiViewCount);
                        rhiD->glFramebufferTextureMultisampleMultiviewOVR(GL_FRAMEBUFFER,
                                                                          GL_STENCIL_ATTACHMENT,
                                                                          nonMsaaThrowawayDepthTexture,
                                                                          0,
                                                                          depthTexD->sampleCount(),
                                                                          0,
                                                                          multiViewCount);
                    }
                } else {
                    // The depth texture here must be an array with at least
                    // multiViewCount elements, and the format should be D24 or D32F
                    // for depth only, or D24S8 for depth and stencil.
                    rhiD->glFramebufferTextureMultiviewOVR(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, depthTexD->texture,
                                                           0, 0, multiViewCount);
                    if (rhiD->isStencilSupportingFormat(depthTexD->format())) {
                        rhiD->glFramebufferTextureMultiviewOVR(GL_FRAMEBUFFER, GL_STENCIL_ATTACHMENT, depthTexD->texture,
                                                               0, 0, multiViewCount);
                    }
                }
            }
            if (d.colorAttCount == 0) {
                d.pixelSize = depthTexD->pixelSize();
                d.sampleCount = depthTexD->sampleCount();
            }
        }
        d.dsAttCount = 1;
    } else {
        d.dsAttCount = 0;
    }

    d.dpr = 1;
    d.rp = QRHI_RES(QGles2RenderPassDescriptor, m_renderPassDesc);

    GLenum status = rhiD->f->glCheckFramebufferStatus(GL_FRAMEBUFFER);
    if (status != GL_NO_ERROR && status != GL_FRAMEBUFFER_COMPLETE) {
        qWarning("Framebuffer incomplete: 0x%x", status);
        return false;
    }

    if (rhiD->glObjectLabel)
        rhiD->glObjectLabel(GL_FRAMEBUFFER, framebuffer, -1, m_objectName.constData());

    QRhiRenderTargetAttachmentTracker::updateResIdList<QGles2Texture, QGles2RenderBuffer>(m_desc, &d.currentResIdList);

    rhiD->registerResource(this);
    return true;
}